

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O3

bool __thiscall miniros::ServiceManager::unadvertiseService(ServiceManager *this,string *serv_name)

{
  pointer __s2;
  size_t __n;
  element_type *peVar1;
  int iVar2;
  iterator __position;
  bool bVar3;
  ServicePublicationPtr pub;
  string local_50;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->shutting_down_mutex_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (this->shutting_down_ == false) {
    pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->service_publications_mutex_);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    __position._M_node =
         (this->service_publications_).
         super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    if ((ServiceManager *)__position._M_node != this) {
      __s2 = (serv_name->_M_dataplus)._M_p;
      __n = serv_name->_M_string_length;
      do {
        peVar1 = (element_type *)__position._M_node[1]._M_next;
        if (((peVar1->name_)._M_string_length == __n) &&
           (((__n == 0 || (iVar2 = bcmp((peVar1->name_)._M_dataplus._M_p,__s2,__n), iVar2 == 0)) &&
            (peVar1->dropped_ == false)))) {
          pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               peVar1;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&pub.
                      super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__position._M_node[1]._M_prev);
          std::__cxx11::
          list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
          ::_M_erase(&this->service_publications_,__position);
          break;
        }
        __position._M_node = (__position._M_node)->_M_next;
      } while ((ServiceManager *)__position._M_node != this);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->service_publications_mutex_);
    bVar3 = pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0;
    if (bVar3) {
      unregisterService(this,&(pub.
                               super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->name_);
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (unadvertiseService::loc.initialized_ == false) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"miniros.service_manager","");
        console::initializeLogLocation(&unadvertiseService::loc,&local_50,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (unadvertiseService::loc.level_ != Debug) {
        console::setLogLocationLevel(&unadvertiseService::loc,Debug);
        console::checkLogLocationEnabled(&unadvertiseService::loc);
      }
      if (unadvertiseService::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,unadvertiseService::loc.logger_,
                       unadvertiseService::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                       ,0xb3,"bool miniros::ServiceManager::unadvertiseService(const string &)",
                       "shutting down service [%s]",
                       ((pub.
                         super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->name_)._M_dataplus._M_p);
      }
      ServicePublication::drop
                (pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    if (pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (pub.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    bVar3 = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->shutting_down_mutex_);
  return bVar3;
}

Assistant:

bool ServiceManager::unadvertiseService(const string &serv_name)
{
  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_)
  {
    return false;
  }

  ServicePublicationPtr pub;
  {
    std::scoped_lock<std::mutex> lock(service_publications_mutex_);

    for (auto i = service_publications_.begin(); i != service_publications_.end(); ++i)
    {
      if((*i)->getName() == serv_name && !(*i)->isDropped())
      {
        pub = *i;
        service_publications_.erase(i);
        break;
      }
    }
  }

  if (pub)
  {
    unregisterService(pub->getName());
    MINIROS_DEBUG( "shutting down service [%s]", pub->getName().c_str());
    pub->drop();
    return true;
  }

  return false;
}